

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::setUnixProcessParameters(QProcess *this,UnixProcessParameters *params)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  pointer __p;
  _func_int **pp_Var4;
  QObjectData *pQVar5;
  
  pQVar5 = (this->super_QIODevice).super_QObject.d_ptr.d;
  pp_Var4 = pQVar5[8]._vptr_QObjectData;
  if (pp_Var4 == (_func_int **)0x0) {
    pQVar5 = pQVar5 + 8;
    __p = (pointer)operator_new(0x40);
    *(undefined8 *)&(__p->childProcessModifier).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p->childProcessModifier).super__Function_base._M_functor + 8) = 0;
    (__p->childProcessModifier).super__Function_base._M_manager = (_Manager_type)0x0;
    (__p->childProcessModifier)._M_invoker = (_Invoker_type)0x0;
    (__p->processParameters).flags = (QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>)0x0;
    (__p->processParameters).lowestFileDescriptorToClose = 0;
    (__p->processParameters)._reserved[0] = 0;
    (__p->processParameters)._reserved[1] = 0;
    (__p->processParameters)._reserved[2] = 0;
    (__p->processParameters)._reserved[3] = 0;
    (__p->processParameters)._reserved[4] = 0;
    (__p->processParameters)._reserved[5] = 0;
    std::
    __uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::reset((__uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             *)pQVar5,__p);
    pp_Var4 = pQVar5->_vptr_QObjectData;
  }
  p_Var1 = *(_func_int **)params;
  p_Var2 = *(_func_int **)params->_reserved;
  p_Var3 = *(_func_int **)(params->_reserved + 4);
  pp_Var4[6] = *(_func_int **)(params->_reserved + 2);
  pp_Var4[7] = p_Var3;
  pp_Var4[4] = p_Var1;
  pp_Var4[5] = p_Var2;
  return;
}

Assistant:

void QProcess::setUnixProcessParameters(const UnixProcessParameters &params)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->processParameters = params;
}